

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void divide_nalus(void)

{
  uint8_t *puVar1;
  ulong uVar2;
  uint32_t uVar3;
  ulong uVar4;
  ulong uVar5;
  
  puVar1 = buf;
  uVar2 = buf_size - 6;
  uVar5 = 0;
  uVar3 = au_pos;
  while (uVar4 = uVar5, uVar4 < uVar2) {
    uVar5 = uVar4 + 1;
    if (*(int *)(puVar1 + uVar4) == 0x1000000) {
      uVar5 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
      au_pos = uVar3;
      au_buf[uVar5] = uVar4 + 1;
      uVar5 = uVar4 + 4;
    }
  }
  return;
}

Assistant:

void divide_nalus()
{

    for(uint64_t i = 0; i < buf_size - 6;)
    {
        uint32_t re_buf_cache = *((uint32_t *)(buf + i));
        if(0x01000000 == re_buf_cache)
        {
            au_buf[au_pos++] = i + 1;
            i += 4;
        }
        else
            i++;
    }
}